

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.hpp
# Opt level: O2

void __thiscall
boost::unordered::detail::
table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
::reserve_for_insert
          (table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
           *this,size_t size)

{
  ulong uVar1;
  size_t sVar2;
  
  if (this->buckets_ == (bucket_pointer)0x0) {
    sVar2 = min_buckets_for_size(this,size);
    uVar1 = this->bucket_count_;
    if (this->bucket_count_ <= sVar2) {
      uVar1 = sVar2;
    }
    create_buckets(this,uVar1);
    return;
  }
  if (this->max_load_ < size) {
    uVar1 = (this->size_ >> 1) + this->size_;
    if (uVar1 <= size) {
      uVar1 = size;
    }
    sVar2 = min_buckets_for_size(this,uVar1);
    if (sVar2 != this->bucket_count_) {
      table_impl<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
      ::rehash_impl((table_impl<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
                     *)this,sVar2);
      return;
    }
  }
  return;
}

Assistant:

inline void table<Types>::reserve_for_insert(std::size_t size)
    {
        if (!buckets_) {
            create_buckets((std::max)(bucket_count_,
                min_buckets_for_size(size)));
        }
        // According to the standard this should be 'size >= max_load_',
        // but I think this is better, defect report filed.
        else if(size > max_load_) {
            std::size_t num_buckets
                = min_buckets_for_size((std::max)(size,
                    size_ + (size_ >> 1)));

            if (num_buckets != bucket_count_)
                static_cast<table_impl*>(this)->rehash_impl(num_buckets);
        }
    }